

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemSizeCalculator.cpp
# Opt level: O1

void __thiscall MemSizeCalculator::calculate(MemSizeCalculator *this)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  Function **function;
  _Hash_node_base *p_Var3;
  
  for (p_Var2 = (this->symbolTable->classes)._M_h._M_before_begin._M_nxt;
      p_Var2 != (_Hash_node_base *)0x0; p_Var2 = p_Var2->_M_nxt) {
    calculateClass(this,(Class *)p_Var2[5]._M_nxt);
  }
  for (p_Var2 = (this->symbolTable->freeFunctions)._M_h._M_before_begin._M_nxt;
      p_Var2 != (_Hash_node_base *)0x0; p_Var2 = p_Var2->_M_nxt) {
    p_Var1 = p_Var2[6]._M_nxt;
    for (p_Var3 = p_Var2[5]._M_nxt; p_Var3 != p_Var1; p_Var3 = p_Var3 + 1) {
      calculateFunction(this,(Function *)p_Var3->_M_nxt);
    }
  }
  calculateFunction(this,this->symbolTable->main);
  return;
}

Assistant:

void MemSizeCalculator::calculate() {
    for (auto &_class : symbolTable->classes) calculateClass(_class.second);
    for (auto &functions: symbolTable->freeFunctions)
        for (auto &function : functions.second) calculateFunction(function);

    //calculate mem size for main function
    calculateFunction(symbolTable->main);
}